

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# task_base.h
# Opt level: O2

void __thiscall
async::detail::task_result<async::detail::fake_void>::~task_result
          (task_result<async::detail::fake_void> *this)

{
  if ((this->super_task_result_holder<async::detail::fake_void>).super_task_base.state._M_i ==
      canceled) {
    std::__exception_ptr::exception_ptr::~exception_ptr
              ((exception_ptr *)
               &(this->super_task_result_holder<async::detail::fake_void>).super_task_base.
                field_0x20);
  }
  continuation_vector::~continuation_vector
            (&(this->super_task_result_holder<async::detail::fake_void>).super_task_base.
              continuations);
  return;
}

Assistant:

~task_result()
	{
		// Exception is only present if the task was canceled
		if (this->state.load(std::memory_order_relaxed) == task_state::canceled)
			reinterpret_cast<std::exception_ptr*>(&this->except)->~exception_ptr();
	}